

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

StructReader * __thiscall
capnp::_::OrphanBuilder::asStructReader
          (StructReader *__return_storage_ptr__,OrphanBuilder *this,StructSize size)

{
  SegmentBuilder **ppSVar1;
  ushort uVar2;
  StructPointerCount SVar3;
  CapTableReader *pCVar4;
  Arena *pAVar5;
  word *pwVar6;
  size_t sVar7;
  ReadLimiter *pRVar8;
  char cVar9;
  int iVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  undefined4 in_register_00000014;
  bool bVar14;
  uint uVar15;
  ulong uVar16;
  SegmentBuilder **ppSVar17;
  OrphanBuilder *pOVar18;
  DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *this_00;
  SegmentBuilder *local_70;
  SegmentReader *newSegment;
  DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> _kjCondition;
  Fault f_2;
  
  local_70 = this->segment;
  pCVar4 = &this->capTable->super_CapTableReader;
  if (*(int *)((long)&(this->tag).content + 4) == 0 && (int)(this->tag).content == 0)
  goto LAB_0037154c;
  ppSVar17 = (SegmentBuilder **)this->location;
  pOVar18 = this;
  if ((local_70 != (SegmentBuilder *)0x0) && (((this->tag).content & 3) == 2)) {
    pAVar5 = (local_70->super_SegmentReader).arena;
    iVar10 = (*pAVar5->_vptr_Arena[2])
                       (pAVar5,(ulong)*(uint *)((long)&(this->tag).content + 4),
                        CONCAT44(in_register_00000014,size));
    local_70 = (SegmentBuilder *)CONCAT44(extraout_var,iVar10);
    _kjCondition.left = (SegmentReader **)&local_70;
    _kjCondition.right = (void *)0x0;
    _kjCondition.op.content.ptr = " != ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = local_70 != (SegmentBuilder *)0x0;
    if (local_70 == (SegmentBuilder *)0x0) {
      this_00 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[49]>
                ((Fault *)this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x244,FAILED,"segment != nullptr",
                 "_kjCondition,\"Message contains far pointer to unknown segment.\"",&_kjCondition,
                 (char (*) [49])"Message contains far pointer to unknown segment.");
    }
    else {
      uVar15 = (uint)(this->tag).content;
      uVar11 = (ulong)(uVar15 >> 3);
      uVar13 = (local_70->super_SegmentReader).ptr.size_;
      if ((long)uVar13 < (long)uVar11) {
        uVar11 = uVar13;
      }
      pOVar18 = (OrphanBuilder *)((local_70->super_SegmentReader).ptr.ptr + uVar11);
      if (local_70 == (SegmentBuilder *)0x0) {
        newSegment = (SegmentReader *)CONCAT71(newSegment._1_7_,1);
LAB_003711f7:
        if (((this->tag).content & 4) == 0) {
          ppSVar1 = &pOVar18->segment;
          lVar12 = (long)((int)(pOVar18->tag).content >> 2);
          if (local_70 == (SegmentBuilder *)0x0) {
            ppSVar17 = ppSVar1 + lVar12;
          }
          else {
            pwVar6 = (local_70->super_SegmentReader).ptr.ptr;
            ppSVar17 = (SegmentBuilder **)(pwVar6 + (local_70->super_SegmentReader).ptr.size_);
            if (((long)pwVar6 - (long)ppSVar1 >> 3 <= lVar12) &&
               (lVar12 <= (long)ppSVar17 - (long)ppSVar1 >> 3)) {
              ppSVar17 = ppSVar1 + lVar12;
            }
          }
          goto LAB_003713ca;
        }
        pAVar5 = (local_70->super_SegmentReader).arena;
        iVar10 = (*pAVar5->_vptr_Arena[2])
                           (pAVar5,(ulong)*(uint *)((long)&(pOVar18->tag).content + 4));
        newSegment = (SegmentReader *)CONCAT44(extraout_var_00,iVar10);
        _kjCondition.left = &newSegment;
        _kjCondition.right = (void *)0x0;
        _kjCondition.op.content.ptr = " != ";
        _kjCondition.op.content.size_ = 5;
        _kjCondition.result = (SegmentBuilder *)newSegment != (SegmentBuilder *)0x0;
        if ((SegmentBuilder *)newSegment == (SegmentBuilder *)0x0) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[56]>
                    (&f_2,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x25f,FAILED,"newSegment != nullptr",
                     "_kjCondition,\"Message contains double-far pointer to unknown segment.\"",
                     &_kjCondition,
                     (char (*) [56])"Message contains double-far pointer to unknown segment.");
LAB_003713b7:
          ppSVar17 = (SegmentBuilder **)0x0;
          kj::_::Debug::Fault::~Fault(&f_2);
        }
        else {
          uVar15 = (uint)(pOVar18->tag).content & 3;
          _kjCondition.left = (SegmentReader **)CONCAT44(2,uVar15);
          _kjCondition.right = anon_var_dwarf_3a16;
          _kjCondition.op.content.ptr = &DAT_00000005;
          _kjCondition.op.content.size_ = (size_t)(uVar15 == 2);
          if (uVar15 != 2) {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[51]>
                      (&f_2,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x263,FAILED,"pad->kind() == WirePointer::FAR",
                       "_kjCondition,\"Second word of double-far pad must be far pointer.\"",
                       (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                       &_kjCondition,
                       (char (*) [51])"Second word of double-far pad must be far pointer.");
            goto LAB_003713b7;
          }
          uVar13 = (ulong)((uint)(pOVar18->tag).content >> 3);
          sVar7 = (((SegmentBuilder *)newSegment)->super_SegmentReader).ptr.size_;
          if ((long)sVar7 < (long)uVar13) {
            uVar13 = sVar7;
          }
          ppSVar17 = (SegmentBuilder **)
                     ((((SegmentBuilder *)newSegment)->super_SegmentReader).ptr.ptr + uVar13);
          local_70 = (SegmentBuilder *)newSegment;
        }
        pOVar18 = (OrphanBuilder *)&pOVar18->segment;
        goto LAB_003713ca;
      }
      uVar16 = 2 - (ulong)((uVar15 & 4) == 0);
      if (uVar13 < uVar11 + uVar16) {
        newSegment = (SegmentReader *)((ulong)newSegment._1_7_ << 8);
      }
      else {
        pRVar8 = (local_70->super_SegmentReader).readLimiter;
        uVar13 = pRVar8->limit;
        if (uVar13 < uVar16) {
          (*((local_70->super_SegmentReader).arena)->_vptr_Arena[3])();
        }
        else {
          pRVar8->limit = uVar13 - uVar16;
        }
        newSegment = (SegmentReader *)CONCAT71(newSegment._1_7_,uVar16 <= uVar13);
        if (uVar16 <= uVar13) goto LAB_003711f7;
      }
      this_00 = &_kjCondition;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[318]>
                ((Fault *)this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x24d,FAILED,"boundsCheck(segment, ptr, padWords)",
                 "_kjCondition,\"Message contains out-of-bounds far pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                 ,(DebugExpression<bool> *)&newSegment,
                 (char (*) [318])
                 "Message contains out-of-bounds far pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                );
    }
    kj::_::Debug::Fault::~Fault((Fault *)this_00);
    ppSVar17 = (SegmentBuilder **)0x0;
    pOVar18 = this;
  }
LAB_003713ca:
  if (ppSVar17 == (SegmentBuilder **)0x0) {
    cVar9 = (ppSVar17 == (SegmentBuilder **)0x0) * '\x02';
  }
  else {
    uVar15 = (uint)(pOVar18->tag).content & 3;
    _kjCondition.left = (SegmentReader **)(ulong)uVar15;
    _kjCondition.right = anon_var_dwarf_3a16;
    _kjCondition.op.content.ptr = &DAT_00000005;
    _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar15 == 0);
    if (uVar15 == 0) {
      if (local_70 == (SegmentBuilder *)0x0) {
        bVar14 = true;
      }
      else {
        uVar13 = (ulong)*(ushort *)((long)&(pOVar18->tag).content + 4) +
                 (ulong)*(ushort *)((long)&(pOVar18->tag).content + 6);
        if ((local_70->super_SegmentReader).ptr.size_ <
            ((long)ppSVar17 - (long)(local_70->super_SegmentReader).ptr.ptr >> 3) + uVar13) {
          bVar14 = false;
        }
        else {
          pRVar8 = (local_70->super_SegmentReader).readLimiter;
          uVar11 = pRVar8->limit;
          bVar14 = uVar11 >= uVar13;
          if (uVar11 < uVar13) {
            (*((local_70->super_SegmentReader).arena)->_vptr_Arena[3])();
          }
          else {
            pRVar8->limit = uVar11 - uVar13;
          }
        }
      }
      newSegment = (SegmentReader *)CONCAT71(newSegment._1_7_,bVar14);
      if (bVar14 == false) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[322]>
                  ((Fault *)&_kjCondition,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x89e,FAILED,"boundsCheck(segment, ptr, ref->structRef.wordSize())",
                   "_kjCondition,\"Message contained out-of-bounds struct pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                   ,(DebugExpression<bool> *)&newSegment,
                   (char (*) [322])
                   "Message contained out-of-bounds struct pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                  );
        kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition);
        cVar9 = '\x02';
      }
      else {
        uVar2 = *(ushort *)((long)&(pOVar18->tag).content + 4);
        SVar3 = *(StructPointerCount *)((long)&(pOVar18->tag).content + 6);
        __return_storage_ptr__->segment = &local_70->super_SegmentReader;
        __return_storage_ptr__->capTable = pCVar4;
        __return_storage_ptr__->data = ppSVar17;
        __return_storage_ptr__->pointers = (WirePointer *)(ppSVar17 + uVar2);
        __return_storage_ptr__->dataSize = (uint)uVar2 << 6;
        __return_storage_ptr__->pointerCount = SVar3;
        __return_storage_ptr__->nestingLimit = 0x7ffffffe;
        cVar9 = '\x01';
      }
    }
    else {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[87]>
                ((Fault *)&newSegment,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x898,FAILED,"ref->kind() == WirePointer::STRUCT",
                 "_kjCondition,\"Schema mismatch: Message contains non-struct pointer where struct pointer\" \"was expected.\""
                 ,(DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                  &_kjCondition,
                 (char (*) [87])
                 "Schema mismatch: Message contains non-struct pointer where struct pointerwas expected."
                );
      kj::_::Debug::Fault::~Fault((Fault *)&newSegment);
      cVar9 = '\x02';
    }
  }
  if (cVar9 != '\x02') {
    return __return_storage_ptr__;
  }
LAB_0037154c:
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->pointers = (WirePointer *)0x0;
  __return_storage_ptr__->segment = (SegmentReader *)0x0;
  __return_storage_ptr__->capTable = (CapTableReader *)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->pointers + 6) = 0;
  __return_storage_ptr__->nestingLimit = 0x7fffffff;
  return __return_storage_ptr__;
}

Assistant:

StructReader OrphanBuilder::asStructReader(StructSize size) const {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));
  return WireHelpers::readStructPointer(
      segment, capTable, tagAsPtr(), location, nullptr, kj::maxValue);
}